

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Opnd * __thiscall
Lowerer::LoadNumberAllocatorValueOpnd(Lowerer *this,Instr *instr,NumberAllocatorValue valueType)

{
  ScriptContextInfo *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemRefOpnd *pMVar6;
  undefined4 *puVar7;
  Func *func;
  void *pMemLoc;
  
  pSVar1 = instr->m_func->m_scriptContextInfo;
  uVar4 = (*pSVar1->_vptr_ScriptContextInfo[0x1d])(pSVar1);
  if (valueType == NumberAllocatorFreeObjectList) {
    iVar5 = (*pSVar1->_vptr_ScriptContextInfo[0x1b])(pSVar1);
    pMemLoc = (void *)(CONCAT44(extraout_var_00,iVar5) + (ulong)(uVar4 & 0xff) * 8);
    func = instr->m_func;
  }
  else {
    if (valueType != NumberAllocatorEndAddress) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0xccb,"(false)","false");
      if (bVar3) {
        *puVar7 = 0;
        return (Opnd *)0x0;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    iVar5 = (*pSVar1->_vptr_ScriptContextInfo[0x1b])(pSVar1);
    pMemLoc = (void *)CONCAT44(extraout_var,iVar5);
    func = instr->m_func;
  }
  pMVar6 = IR::MemRefOpnd::New(pMemLoc,TyUint64,func,AddrOpndKindDynamicMisc);
  return &pMVar6->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::LoadNumberAllocatorValueOpnd(IR::Instr *instr, NumberAllocatorValue valueType)
{
    ScriptContextInfo *scriptContext = instr->m_func->GetScriptContextInfo();
    bool allowNativeCodeBumpAllocation = scriptContext->GetRecyclerAllowNativeCodeBumpAllocation();

    switch (valueType)
    {
    case NumberAllocatorValue::NumberAllocatorEndAddress:
        return IR::MemRefOpnd::New(((char *)scriptContext->GetNumberAllocatorAddr()) + Js::RecyclerJavascriptNumberAllocator::GetEndAddressOffset(), TyMachPtr, instr->m_func);
    case NumberAllocatorValue::NumberAllocatorFreeObjectList:
        return IR::MemRefOpnd::New(
            ((char *)scriptContext->GetNumberAllocatorAddr()) +
                (allowNativeCodeBumpAllocation ? Js::RecyclerJavascriptNumberAllocator::GetFreeObjectListOffset() : Js::RecyclerJavascriptNumberAllocator::GetEndAddressOffset()),
            TyMachPtr, instr->m_func);
    default:
        Assert(false);
        return nullptr;
    }
}